

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

s32 __thiscall irr::core::string<char>::findFirst(string<char> *this,char c)

{
  s32 i;
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (this->used <= lVar1) {
      return -1;
    }
    if (this->array[lVar1] == c) break;
    lVar1 = lVar1 + 1;
  }
  return (s32)lVar1;
}

Assistant:

s32 findFirst(T c) const
	{
		for (s32 i=0; i<used; ++i)
			if (array[i] == c)
				return i;

		return -1;
	}